

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void DoFilter4_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,__m128i *mask,int hev_thresh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar10;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i alVar20;
  char cVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i not_hev;
  __m128i local_48;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  GetNotHEV_SSE2(p1,p0,q0,q1,hev_thresh,&local_48);
  auVar1 = _DAT_00123c00;
  *p1 = (__m128i)((undefined1  [16])*p1 ^ _DAT_00123c00);
  *p0 = (__m128i)((undefined1  [16])*p0 ^ auVar1);
  *q0 = (__m128i)((undefined1  [16])*q0 ^ auVar1);
  alVar20 = *q1;
  *q1 = (__m128i)((undefined1  [16])alVar20 ^ auVar1);
  auVar2 = psubsb((undefined1  [16])*p1,(undefined1  [16])alVar20 ^ auVar1);
  auVar11 = psubsb((undefined1  [16])*q0,(undefined1  [16])*p0);
  auVar2 = paddsb(~(undefined1  [16])local_48 & auVar2,auVar11);
  auVar2 = paddsb(auVar2,auVar11);
  auVar36 = paddsb(auVar2,auVar11);
  auVar2 = paddsb(_DAT_00123c40,auVar36 & (undefined1  [16])*mask);
  auVar37 = paddsb(auVar36 & (undefined1  [16])*mask,_DAT_00123c50);
  auVar19._0_14_ = auVar11._0_14_;
  auVar19[0xe] = auVar11[7];
  auVar19[0xf] = auVar2[7];
  auVar18._14_2_ = auVar19._14_2_;
  auVar18._0_13_ = auVar11._0_13_;
  auVar18[0xd] = auVar2[6];
  auVar17._13_3_ = auVar18._13_3_;
  auVar17._0_12_ = auVar11._0_12_;
  auVar17[0xc] = auVar11[6];
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._0_11_ = auVar11._0_11_;
  auVar16[0xb] = auVar2[5];
  auVar15._11_5_ = auVar16._11_5_;
  auVar15._0_10_ = auVar11._0_10_;
  auVar15[10] = auVar11[5];
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_9_ = auVar11._0_9_;
  auVar14[9] = auVar2[4];
  auVar13._9_7_ = auVar14._9_7_;
  auVar13._0_8_ = auVar11._0_8_;
  auVar13[8] = auVar11[4];
  auVar12._8_8_ = auVar13._8_8_;
  auVar12[7] = auVar2[3];
  auVar12[6] = auVar11[3];
  auVar12[5] = auVar2[2];
  auVar12[4] = auVar11[2];
  auVar12[3] = auVar2[1];
  auVar12[2] = auVar11[1];
  auVar12[0] = auVar11[0];
  auVar12[1] = auVar2[0];
  auVar11[1] = auVar2[8];
  auVar11[0] = auVar2[8];
  auVar11[2] = auVar2[9];
  auVar11[3] = auVar2[9];
  auVar11[4] = auVar2[10];
  auVar11[5] = auVar2[10];
  auVar11[6] = auVar2[0xb];
  auVar11[7] = auVar2[0xb];
  auVar11[8] = auVar2[0xc];
  auVar11[9] = auVar2[0xc];
  auVar11[10] = auVar2[0xd];
  auVar11[0xb] = auVar2[0xd];
  auVar11[0xc] = auVar2[0xe];
  auVar11[0xd] = auVar2[0xe];
  auVar11[0xf] = auVar2[0xf];
  auVar11[0xe] = auVar11[0xf];
  auVar36 = psraw(auVar12,0xb);
  auVar2 = psraw(auVar11,0xb);
  auVar11 = packsswb(auVar36,auVar2);
  auVar9._0_14_ = auVar2._0_14_;
  auVar9[0xe] = auVar2[7];
  auVar9[0xf] = auVar37[7];
  auVar8._14_2_ = auVar9._14_2_;
  auVar8._0_13_ = auVar2._0_13_;
  auVar8[0xd] = auVar37[6];
  auVar7._13_3_ = auVar8._13_3_;
  auVar7._0_12_ = auVar2._0_12_;
  auVar7[0xc] = auVar2[6];
  auVar6._12_4_ = auVar7._12_4_;
  auVar6._0_11_ = auVar2._0_11_;
  auVar6[0xb] = auVar37[5];
  auVar5._11_5_ = auVar6._11_5_;
  auVar5._0_10_ = auVar2._0_10_;
  auVar5[10] = auVar2[5];
  auVar36._10_6_ = auVar5._10_6_;
  auVar36._0_9_ = auVar2._0_9_;
  auVar36[9] = auVar37[4];
  auVar4._9_7_ = auVar36._9_7_;
  auVar4._0_8_ = auVar2._0_8_;
  auVar4[8] = auVar2[4];
  auVar3._8_8_ = auVar4._8_8_;
  auVar3[7] = auVar37[3];
  auVar3[6] = auVar2[3];
  auVar3[5] = auVar37[2];
  auVar3[4] = auVar2[2];
  auVar3[3] = auVar37[1];
  auVar3[2] = auVar2[1];
  auVar3[0] = auVar2[0];
  auVar3[1] = auVar37[0];
  auVar38[1] = auVar37[8];
  auVar38[0] = auVar37[8];
  auVar38[2] = auVar37[9];
  auVar38[3] = auVar37[9];
  auVar38[4] = auVar37[10];
  auVar38[5] = auVar37[10];
  auVar38[6] = auVar37[0xb];
  auVar38[7] = auVar37[0xb];
  auVar38[8] = auVar37[0xc];
  auVar38[9] = auVar37[0xc];
  auVar38[10] = auVar37[0xd];
  auVar38[0xb] = auVar37[0xd];
  auVar38[0xc] = auVar37[0xe];
  auVar38[0xd] = auVar37[0xe];
  auVar38[0xf] = auVar37[0xf];
  auVar38[0xe] = auVar38[0xf];
  auVar2 = psraw(auVar3,0xb);
  auVar36 = psraw(auVar38,0xb);
  auVar2 = packsswb(auVar2,auVar36);
  alVar20 = (__m128i)paddsb(auVar11,(undefined1  [16])*p0);
  *p0 = alVar20;
  alVar20 = (__m128i)psubsb((undefined1  [16])*q0,auVar2);
  *q0 = alVar20;
  *p0 = (__m128i)((undefined1  [16])*p0 ^ auVar1);
  auVar2 = auVar2 ^ _DAT_00123c00;
  cVar10 = pavgb(0,auVar2[0]);
  cVar21 = pavgb(0,auVar2[1]);
  cVar22 = pavgb(0,auVar2[2]);
  cVar23 = pavgb(0,auVar2[3]);
  cVar24 = pavgb(0,auVar2[4]);
  cVar25 = pavgb(0,auVar2[5]);
  cVar26 = pavgb(0,auVar2[6]);
  cVar27 = pavgb(0,auVar2[7]);
  cVar28 = pavgb(0,auVar2[8]);
  cVar29 = pavgb(0,auVar2[9]);
  cVar30 = pavgb(0,auVar2[10]);
  cVar31 = pavgb(0,auVar2[0xb]);
  cVar32 = pavgb(0,auVar2[0xc]);
  cVar33 = pavgb(0,auVar2[0xd]);
  cVar34 = pavgb(0,auVar2[0xe]);
  cVar35 = pavgb(0,auVar2[0xf]);
  auVar2[0] = cVar10 + -0x40;
  auVar2[1] = cVar21 + -0x40;
  auVar2[2] = cVar22 + -0x40;
  auVar2[3] = cVar23 + -0x40;
  auVar2[4] = cVar24 + -0x40;
  auVar2[5] = cVar25 + -0x40;
  auVar2[6] = cVar26 + -0x40;
  auVar2[7] = cVar27 + -0x40;
  auVar2[8] = cVar28 + -0x40;
  auVar2[9] = cVar29 + -0x40;
  auVar2[10] = cVar30 + -0x40;
  auVar2[0xb] = cVar31 + -0x40;
  auVar2[0xc] = cVar32 + -0x40;
  auVar2[0xd] = cVar33 + -0x40;
  auVar2[0xe] = cVar34 + -0x40;
  auVar2[0xf] = cVar35 + -0x40;
  *q0 = (__m128i)((undefined1  [16])*q0 ^ auVar1);
  alVar20 = (__m128i)psubsb((undefined1  [16])*q1,auVar2 & (undefined1  [16])local_48);
  *q1 = alVar20;
  auVar2 = paddsb(auVar2 & (undefined1  [16])local_48,(undefined1  [16])*p1);
  *p1 = (__m128i)(auVar2 ^ auVar1);
  *q1 = (__m128i)(auVar1 ^ (undefined1  [16])*q1);
  return;
}

Assistant:

static WEBP_INLINE void DoFilter4_SSE2(__m128i* const p1, __m128i* const p0,
                                       __m128i* const q0, __m128i* const q1,
                                       const __m128i* const mask,
                                       int hev_thresh) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i sign_bit = _mm_set1_epi8((char)0x80);
  const __m128i k64 = _mm_set1_epi8(64);
  const __m128i k3 = _mm_set1_epi8(3);
  const __m128i k4 = _mm_set1_epi8(4);
  __m128i not_hev;
  __m128i t1, t2, t3;

  // compute hev mask
  GetNotHEV_SSE2(p1, p0, q0, q1, hev_thresh, &not_hev);

  // convert to signed values
  FLIP_SIGN_BIT4(*p1, *p0, *q0, *q1);

  t1 = _mm_subs_epi8(*p1, *q1);        // p1 - q1
  t1 = _mm_andnot_si128(not_hev, t1);  // hev(p1 - q1)
  t2 = _mm_subs_epi8(*q0, *p0);        // q0 - p0
  t1 = _mm_adds_epi8(t1, t2);          // hev(p1 - q1) + 1 * (q0 - p0)
  t1 = _mm_adds_epi8(t1, t2);          // hev(p1 - q1) + 2 * (q0 - p0)
  t1 = _mm_adds_epi8(t1, t2);          // hev(p1 - q1) + 3 * (q0 - p0)
  t1 = _mm_and_si128(t1, *mask);       // mask filter values we don't care about

  t2 = _mm_adds_epi8(t1, k3);        // 3 * (q0 - p0) + hev(p1 - q1) + 3
  t3 = _mm_adds_epi8(t1, k4);        // 3 * (q0 - p0) + hev(p1 - q1) + 4
  SignedShift8b_SSE2(&t2);           // (3 * (q0 - p0) + hev(p1 - q1) + 3) >> 3
  SignedShift8b_SSE2(&t3);           // (3 * (q0 - p0) + hev(p1 - q1) + 4) >> 3
  *p0 = _mm_adds_epi8(*p0, t2);      // p0 += t2
  *q0 = _mm_subs_epi8(*q0, t3);      // q0 -= t3
  FLIP_SIGN_BIT2(*p0, *q0);

  // this is equivalent to signed (a + 1) >> 1 calculation
  t2 = _mm_add_epi8(t3, sign_bit);
  t3 = _mm_avg_epu8(t2, zero);
  t3 = _mm_sub_epi8(t3, k64);

  t3 = _mm_and_si128(not_hev, t3);   // if !hev
  *q1 = _mm_subs_epi8(*q1, t3);      // q1 -= t3
  *p1 = _mm_adds_epi8(*p1, t3);      // p1 += t3
  FLIP_SIGN_BIT2(*p1, *q1);
}